

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

void __thiscall duckdb::Transaction::~Transaction(Transaction *this)

{
  ~Transaction(this);
  operator_delete(this);
  return;
}

Assistant:

Transaction::~Transaction() {
}